

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void * __thiscall Js::FunctionProxy::GetAuxPtrWithLock(FunctionProxy *this,AuxPointerType e)

{
  void *pvVar1;
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  
  if ((this->auxPtrs).ptr == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    local_20.cs = &this->m_scriptContext->threadContext->csFunctionBody;
    CCLock::Enter(&(local_20.cs)->super_CCLock);
    pvVar1 = AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::GetAuxPtr(this,e);
    AutoCriticalSection::~AutoCriticalSection(&local_20);
  }
  return pvVar1;
}

Assistant:

void* FunctionProxy::GetAuxPtrWithLock(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

#if DBG && ENABLE_NATIVE_CODEGEN && defined(_WIN32)
        // the lock for work item queue should not be locked while accessing AuxPtrs in background thread
        auto jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
        auto jobProcessorCS = jobProcessor->GetCriticalSection();

        // ->IsLocked is not supported on xplat
        Assert(!jobProcessorCS || !jobProcessor->ProcessesInBackground() || !jobProcessorCS->IsLocked());
#endif

        AutoCriticalSection autoCS(this->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
        return AuxPtrsT::GetAuxPtr(this, e);
    }